

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O2

void * cppcms::impl::mmap_anonymous(size_t size)

{
  int err;
  void *pvVar1;
  int *piVar2;
  cppcms_error *this;
  allocator local_41;
  string local_40;
  
  pvVar1 = mmap((void *)0x0,size,3,0x21,-1,0);
  piVar2 = __errno_location();
  if (pvVar1 != (void *)0xffffffffffffffff) {
    return pvVar1;
  }
  err = *piVar2;
  this = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_40,"Failed to create shared memory",&local_41);
  cppcms_error::cppcms_error(this,err,&local_40);
  __cxa_throw(this,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

inline void *mmap_anonymous(size_t size)
	{
		#if defined(MAP_ANONYMOUS)
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE, MAP_ANONYMOUS | MAP_SHARED, -1, 0);
		int err=errno;
		#elif defined(MAP_ANON)
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE, MAP_ANON | MAP_SHARED, -1, 0);
		int err=errno;
		#else
		int fd=::open("/dev/null",O_RDWR);
		if(fd < 0) 
			throw cppcms_error(errno,"Failed to open /dev/null");
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE,MAP_SHARED, fd, 0);
		int err=errno;
		::close(fd);
		#endif
		if(p==MAP_FAILED)
			throw cppcms_error(err,"Failed to create shared memory");
		return p;
	}